

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O3

bool __thiscall Opcode::AABBQuantizedTree::Build(AABBQuantizedTree *this,AABBTree *tree)

{
  AABBCollisionNode *linear;
  AABBCollisionNode *pAVar1;
  sword *psVar2;
  ulong *puVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  AABBQuantizedNode *pAVar7;
  AABBQuantizedNode *pAVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  AABBQuantizedNode *pAVar17;
  udword j;
  uword *puVar18;
  uword uVar19;
  ulong uVar20;
  undefined4 uVar21;
  int iVar28;
  undefined1 auVar22 [16];
  undefined4 uVar29;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar38;
  undefined1 auVar37 [16];
  float fVar39;
  udword CurID;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  udword local_34;
  undefined1 auVar23 [16];
  
  if (tree == (AABBTree *)0x0) {
    return false;
  }
  uVar16 = tree->mTotalNbNodes;
  if (uVar16 == (tree->super_AABBTreeNode).mNbPrimitives * 2 - 1) {
    (this->super_AABBOptimizedTree).mNbNodes = uVar16;
    pAVar7 = this->mNodes;
    if (pAVar7 != (AABBQuantizedNode *)0x0) {
      operator_delete__(&pAVar7[-1].mData,pAVar7[-1].mData * 0x18 + 8);
      this->mNodes = (AABBQuantizedNode *)0x0;
      uVar16 = (this->super_AABBOptimizedTree).mNbNodes;
    }
    uVar20 = (ulong)uVar16;
    puVar11 = (ulong *)operator_new__(uVar20 << 5 | 8);
    *puVar11 = uVar20;
    auVar31 = _DAT_001e8190;
    auVar26 = _DAT_001e8180;
    linear = (AABBCollisionNode *)(puVar11 + 1);
    if (uVar16 != 0) {
      uVar14 = uVar20 + 0x7ffffffffffffff & 0x7ffffffffffffff;
      auVar22._8_4_ = (int)uVar14;
      auVar22._0_8_ = uVar14;
      auVar22._12_4_ = (int)(uVar14 >> 0x20);
      lVar15 = 0;
      auVar22 = auVar22 ^ _DAT_001e8190;
      puVar12 = puVar11;
      do {
        auVar34._8_4_ = (int)lVar15;
        auVar34._0_8_ = lVar15;
        auVar34._12_4_ = (int)((ulong)lVar15 >> 0x20);
        auVar34 = (auVar34 | auVar26) ^ auVar31;
        bVar10 = auVar22._0_4_ < auVar34._0_4_;
        iVar28 = auVar22._4_4_;
        iVar38 = auVar34._4_4_;
        if ((bool)(~(iVar28 < iVar38 || iVar38 == iVar28 && bVar10) & 1)) {
          puVar12[4] = 0;
        }
        if (iVar28 >= iVar38 && (iVar38 != iVar28 || !bVar10)) {
          puVar12[8] = 0;
        }
        lVar15 = lVar15 + 2;
        puVar12 = puVar12 + 8;
      } while ((uVar14 - ((uint)(uVar20 + 0x7ffffffffffffff) & 1)) + 2 != lVar15);
    }
    local_34 = 1;
    _BuildCollisionTree(linear,0,&local_34,&tree->super_AABBTreeNode);
    uVar20 = (ulong)(this->super_AABBOptimizedTree).mNbNodes;
    puVar12 = (ulong *)operator_new__(uVar20 * 0x18 + 8);
    pAVar7 = (AABBQuantizedNode *)(puVar12 + 1);
    *puVar12 = uVar20;
    auVar31 = _DAT_001e8190;
    auVar26 = _DAT_001e8180;
    if (uVar20 == 0) {
      this->mNodes = pAVar7;
      auVar26 = _DAT_001f6f00;
      auVar31 = _DAT_001e8300;
    }
    else {
      uVar14 = uVar20 * 0x18 - 0x18;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar14;
      uVar21 = SUB164(auVar9 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
      uVar29 = (undefined4)(uVar14 / 0x180000000);
      auVar23._0_8_ = CONCAT44(uVar29,uVar21);
      auVar23._8_4_ = uVar21;
      auVar23._12_4_ = uVar29;
      auVar24._0_8_ = auVar23._0_8_ >> 4;
      auVar24._8_8_ = auVar23._8_8_ >> 4;
      uVar13 = 0;
      auVar24 = auVar24 ^ _DAT_001e8190;
      puVar3 = puVar12;
      do {
        auVar35._8_4_ = (int)uVar13;
        auVar35._0_8_ = uVar13;
        auVar35._12_4_ = (int)(uVar13 >> 0x20);
        auVar22 = (auVar35 | auVar26) ^ auVar31;
        if ((bool)(~(auVar22._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar22._0_4_ ||
                    auVar24._4_4_ < auVar22._4_4_) & 1)) {
          puVar3[3] = 0;
        }
        if ((auVar22._12_4_ != auVar24._12_4_ || auVar22._8_4_ <= auVar24._8_4_) &&
            auVar22._12_4_ <= auVar24._12_4_) {
          puVar3[6] = 0;
        }
        uVar13 = uVar13 + 2;
        puVar3 = puVar3 + 6;
      } while ((uVar14 / 0x18 + 2 & 0xfffffffffffffffe) != uVar13);
      this->mNodes = pAVar7;
      auVar26 = _DAT_001f6f00;
      auVar31 = _DAT_001e8300;
      if (uVar20 != 0) {
        lVar15 = 0;
        do {
          puVar3 = (ulong *)((long)puVar11 + lVar15 + 8);
          auVar25._0_8_ = *puVar3 & 0x7fffffff7fffffff;
          auVar25._8_4_ = (uint)puVar3[1] & 0x7fffffff;
          auVar25._12_4_ = *(uint *)((long)puVar3 + 0xc) & 0x7fffffff;
          auVar26 = maxps(auVar25,auVar26);
          auVar30._0_8_ = *(ulong *)((long)puVar11 + lVar15 + 0x18) & 0x7fffffff7fffffff;
          auVar30._8_8_ = 0;
          auVar31 = maxps(auVar30,auVar31);
          lVar15 = lVar15 + 0x20;
        } while (uVar20 << 5 != lVar15);
      }
    }
    auVar22 = divps(_DAT_001f6f10,auVar26);
    auVar27._0_4_ = (float)(-(uint)(auVar26._0_4_ != 0.0) & auVar22._0_4_);
    auVar27._4_4_ = (float)(-(uint)(auVar26._4_4_ != 0.0) & auVar22._4_4_);
    auVar27._8_4_ = (float)(-(uint)(auVar26._8_4_ != 0.0) & auVar22._8_4_);
    auVar27._12_4_ = (float)(-(uint)(auVar26._12_4_ != 0.0) & auVar22._12_4_);
    auVar22 = divps(_DAT_001f6f20,auVar31);
    auVar26._0_4_ = (float)(-(uint)(auVar31._0_4_ != 0.0) & auVar22._0_4_);
    auVar26._4_4_ = (float)(-(uint)(auVar31._4_4_ != 0.0) & auVar22._4_4_);
    auVar26._8_4_ = (float)(-(uint)(auVar31._8_4_ != 0.0) & auVar22._8_4_);
    auVar26._12_4_ = (float)(-(uint)(auVar31._12_4_ != 0.0) & auVar22._12_4_);
    auVar31 = divps(_DAT_001f3c90,auVar27);
    (this->mCenterCoeff).x = (float)(auVar31._0_4_ & -(uint)(auVar27._0_4_ != 0.0));
    (this->mCenterCoeff).y = (float)(auVar31._4_4_ & -(uint)(auVar27._4_4_ != 0.0));
    (this->mCenterCoeff).z = (float)(auVar31._8_4_ & -(uint)(auVar27._8_4_ != 0.0));
    (this->mExtentsCoeff).x = (float)(auVar31._12_4_ & -(uint)(auVar27._12_4_ != 0.0));
    auVar31 = divps(_DAT_001eaa50,auVar26);
    (this->mExtentsCoeff).y = (float)(auVar31._0_4_ & -(uint)(auVar26._0_4_ != 0.0));
    (this->mExtentsCoeff).z = (float)(auVar31._4_4_ & -(uint)(auVar26._4_4_ != 0.0));
    if (uVar20 != 0) {
      uVar14 = 0;
      do {
        pAVar8 = pAVar7 + uVar14;
        pAVar1 = linear + uVar14;
        fVar5 = (pAVar1->mAABB).mCenter.x;
        fVar6 = (pAVar1->mAABB).mCenter.y;
        fVar32 = (pAVar1->mAABB).mCenter.z;
        fVar39 = (pAVar1->mAABB).mExtents.x;
        auVar31._0_4_ = (int)(auVar27._0_4_ * fVar5);
        auVar31._4_4_ = (int)(auVar27._4_4_ * fVar6);
        auVar31._8_4_ = (int)(auVar27._8_4_ * fVar32);
        auVar31._12_4_ = (int)(auVar27._12_4_ * fVar39);
        auVar22 = packssdw(auVar31,auVar31);
        uVar13 = auVar22._0_8_ & 0xffffffffffff | auVar31._6_8_ & 0xffff000000000000;
        (pAVar8->mAABB).mCenter[0] = (short)uVar13;
        (pAVar8->mAABB).mCenter[1] = (short)(uVar13 >> 0x10);
        (pAVar8->mAABB).mCenter[2] = (short)(uVar13 >> 0x20);
        (pAVar8->mAABB).mExtents[0] = (short)(uVar13 >> 0x30);
        fVar33 = (float)puVar11[uVar14 * 4 + 3];
        fVar36 = (float)(puVar11[uVar14 * 4 + 3] >> 0x20);
        auVar37._0_4_ = (int)(auVar26._0_4_ * fVar33);
        auVar37._4_4_ = (int)(auVar26._4_4_ * fVar36);
        auVar37._8_4_ = (int)(auVar26._8_4_ * 0.0);
        auVar37._12_4_ = (int)(auVar26._12_4_ * 0.0);
        auVar31 = pshuflw(auVar37,auVar37,0xe8);
        *(int *)((pAVar8->mAABB).mExtents + 1) = auVar31._0_4_;
        local_40 = CONCAT44(fVar6 + fVar33,fVar5 + fVar39);
        local_38 = fVar32 + fVar36;
        local_50 = CONCAT44(fVar6 - fVar33,fVar5 - fVar39);
        local_48 = fVar32 - fVar36;
        lVar15 = 0;
        do {
          psVar2 = (pAVar8->mAABB).mCenter + lVar15;
          puVar18 = (uword *)(psVar2 + 3);
          fVar32 = (float)(int)*psVar2 * (&(this->mCenterCoeff).x)[lVar15];
          fVar5 = (&(this->mExtentsCoeff).x)[lVar15];
          fVar6 = *(float *)((long)&local_40 + lVar15 * 4);
          uVar19 = *puVar18;
          do {
            fVar39 = (float)uVar19 * fVar5;
            if ((fVar6 <= fVar32 + fVar39) &&
               (fVar39 = fVar32 - fVar39, pfVar4 = (float *)((long)&local_50 + lVar15 * 4),
               fVar39 < *pfVar4 || fVar39 == *pfVar4)) {
              if (uVar19 != 0) goto LAB_001acafb;
              break;
            }
            uVar19 = uVar19 + 1;
            *puVar18 = uVar19;
          } while (uVar19 != 0);
          *puVar18 = 0xffff;
LAB_001acafb:
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        pAVar8 = (AABBQuantizedNode *)linear[uVar14].mData;
        pAVar17 = pAVar7 + ((uint)((int)pAVar8 - (int)linear) >> 5);
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar17 = pAVar8;
        }
        puVar12[uVar14 * 3 + 3] = (ulong)pAVar17;
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar20);
    }
    operator_delete__(puVar11,*puVar11 << 5 | 8);
    bVar10 = true;
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool AABBQuantizedTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	mNbNodes = NbNodes;
	DELETEARRAY(mNodes);
	AABBCollisionNode* Nodes = new AABBCollisionNode[mNbNodes];
	CHECKALLOC(Nodes);

	// Build the tree
	udword CurID = 1;
	_BuildCollisionTree(Nodes, 0, CurID, tree);

	// Quantize
	{
		mNodes = new AABBQuantizedNode[mNbNodes];
		CHECKALLOC(mNodes);

		// Get max values
		FIND_MAX_VALUES

		// Quantization
		INIT_QUANTIZATION

		// Quantize
		uintptr_t Data;
		for(udword i=0;i<mNbNodes;i++)
		{
			PERFORM_QUANTIZATION
			REMAP_DATA(mData)
		}

		DELETEARRAY(Nodes);
	}

	return true;
}